

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::validate(MoleculeStamp *this)

{
  pointer piVar1;
  pointer ppRVar2;
  long lVar3;
  pointer piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  bool bVar12;
  vector<int,_std::allocator<int>_> members;
  
  DataHolder::validate(&this->super_DataHolder);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->atom2Rigidbody,
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  piVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar6 = -1;
  for (uVar8 = 0; (ulong)uVar8 < (ulong)((long)piVar4 - (long)piVar1 >> 2); uVar8 = uVar8 + 1) {
    piVar1[uVar8] = iVar6;
    iVar6 = iVar6 + -1;
  }
  for (uVar11 = 0;
      ppRVar2 = (this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->rigidBodyStamps_).
                             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3);
      uVar11 = uVar11 + 1) {
    std::vector<int,_std::allocator<int>_>::vector(&members,&ppRVar2[(int)uVar11]->members_);
    piVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar4 = members.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 != members.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
      piVar1[*piVar4] = (int)uVar11;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&members.super__Vector_base<int,_std::allocator<int>_>);
  }
  checkAtoms(this);
  checkBonds(this);
  fillBondInfo(this);
  checkBends(this);
  checkTorsions(this);
  checkInversions(this);
  checkRigidBodies(this);
  checkCutoffGroups(this);
  checkFragments(this);
  checkConstraints(this);
  ppRVar2 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3;
  lVar9 = 0;
  lVar7 = 0;
  lVar10 = lVar5;
  while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
    lVar3 = *(long *)((long)ppRVar2 + (lVar9 >> 0x1d));
    lVar7 = lVar7 + (*(long *)(lVar3 + 0x78) - *(long *)(lVar3 + 0x70) >> 2);
    lVar9 = lVar9 + 0x100000000;
  }
  this->nintegrable_ =
       (int)((ulong)((long)(this->atomStamps_).
                           super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) +
       ((int)lVar5 - (int)lVar7);
  return;
}

Assistant:

void MoleculeStamp::validate() {
    DataHolder::validate();

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }

    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkFragments();
    checkConstraints();

    size_t nrigidAtoms = 0;
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp = getRigidBodyStamp(i);
      nrigidAtoms += rbStamp->getNMembers();
    }
    nintegrable_ = getNAtoms() + getNRigidBodies() - nrigidAtoms;
  }